

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecmult_gen_impl.h
# Opt level: O2

void secp256k1_ecmult_gen_blind(secp256k1_ecmult_gen_context *ctx,uchar *seed32)

{
  size_t outlen;
  size_t outlen_00;
  int iVar1;
  bool bVar2;
  secp256k1_scalar diff;
  uchar nonce32 [32];
  secp256k1_scalar b;
  secp256k1_rfc6979_hmac_sha256 rng;
  secp256k1_fe f;
  secp256k1_gej gb;
  uchar keydata [64];
  
  secp256k1_scalar_half((secp256k1_scalar *)&gb,&secp256k1_scalar_one);
  secp256k1_scalar_negate((secp256k1_scalar *)&gb,(secp256k1_scalar *)&gb);
  diff.d[2] = 0;
  diff.d[3] = 0;
  diff.d[0] = 1;
  diff.d[1] = 0;
  iVar1 = 0x101;
  while (bVar2 = iVar1 != 0, iVar1 = iVar1 + -1, bVar2) {
    secp256k1_scalar_add(&diff,&diff,&diff);
  }
  secp256k1_scalar_add(&diff,&diff,(secp256k1_scalar *)&gb);
  if (seed32 == (uchar *)0x0) {
    secp256k1_ge_neg(&ctx->ge_offset,&secp256k1_ge_const_g);
    secp256k1_scalar_add(&ctx->scalar_offset,&secp256k1_scalar_one,&diff);
    (ctx->proj_blind).n[0] = 1;
    (ctx->proj_blind).n[1] = 0;
    (ctx->proj_blind).n[2] = 0;
    (ctx->proj_blind).n[3] = 0;
    (ctx->proj_blind).n[4] = 0;
    (ctx->proj_blind).magnitude = 1;
    (ctx->proj_blind).normalized = 1;
  }
  else {
    secp256k1_scalar_get_b32(keydata,&ctx->scalar_offset);
    keydata._32_8_ = *(undefined8 *)seed32;
    keydata._40_8_ = *(undefined8 *)(seed32 + 8);
    keydata._48_8_ = *(undefined8 *)(seed32 + 0x10);
    keydata._56_8_ = *(undefined8 *)(seed32 + 0x18);
    secp256k1_rfc6979_hmac_sha256_initialize(&rng,keydata,0x40);
    secp256k1_memclear(keydata,0x40);
    secp256k1_rfc6979_hmac_sha256_generate(&rng,nonce32,outlen);
    secp256k1_fe_set_b32_mod(&f,nonce32);
    iVar1 = secp256k1_fe_normalizes_to_zero(&f);
    secp256k1_fe_cmov(&f,&secp256k1_fe_one,iVar1);
    (ctx->proj_blind).n[4] = f.n[4];
    (ctx->proj_blind).magnitude = f.magnitude;
    (ctx->proj_blind).normalized = f.normalized;
    (ctx->proj_blind).n[2] = f.n[2];
    (ctx->proj_blind).n[3] = f.n[3];
    (ctx->proj_blind).n[0] = f.n[0];
    (ctx->proj_blind).n[1] = f.n[1];
    secp256k1_rfc6979_hmac_sha256_generate(&rng,nonce32,outlen_00);
    secp256k1_scalar_set_b32(&b,nonce32,(int *)0x0);
    iVar1 = secp256k1_scalar_is_zero(&b);
    secp256k1_scalar_cmov(&b,&secp256k1_scalar_one,iVar1);
    secp256k1_ecmult_gen(ctx,&gb,&b);
    secp256k1_scalar_negate(&b,&b);
    secp256k1_scalar_add(&ctx->scalar_offset,&b,&diff);
    secp256k1_ge_set_gej(&ctx->ge_offset,&gb);
    secp256k1_memclear(nonce32,0x20);
    secp256k1_scalar_clear(&b);
    secp256k1_gej_clear(&gb);
    secp256k1_fe_clear(&f);
    secp256k1_rfc6979_hmac_sha256_clear(&rng);
  }
  return;
}

Assistant:

static void secp256k1_ecmult_gen_blind(secp256k1_ecmult_gen_context *ctx, const unsigned char *seed32) {
    secp256k1_scalar b;
    secp256k1_scalar diff;
    secp256k1_gej gb;
    secp256k1_fe f;
    unsigned char nonce32[32];
    secp256k1_rfc6979_hmac_sha256 rng;
    unsigned char keydata[64];

    /* Compute the (2^COMB_BITS - 1)/2 term once. */
    secp256k1_ecmult_gen_scalar_diff(&diff);

    if (seed32 == NULL) {
        /* When seed is NULL, reset the final point and blinding value. */
        secp256k1_ge_neg(&ctx->ge_offset, &secp256k1_ge_const_g);
        secp256k1_scalar_add(&ctx->scalar_offset, &secp256k1_scalar_one, &diff);
        ctx->proj_blind = secp256k1_fe_one;
        return;
    }
    /* The prior blinding value (if not reset) is chained forward by including it in the hash. */
    secp256k1_scalar_get_b32(keydata, &ctx->scalar_offset);
    /** Using a CSPRNG allows a failure free interface, avoids needing large amounts of random data,
     *   and guards against weak or adversarial seeds.  This is a simpler and safer interface than
     *   asking the caller for blinding values directly and expecting them to retry on failure.
     */
    VERIFY_CHECK(seed32 != NULL);
    memcpy(keydata + 32, seed32, 32);
    secp256k1_rfc6979_hmac_sha256_initialize(&rng, keydata, 64);
    secp256k1_memclear(keydata, sizeof(keydata));

    /* Compute projective blinding factor (cannot be 0). */
    secp256k1_rfc6979_hmac_sha256_generate(&rng, nonce32, 32);
    secp256k1_fe_set_b32_mod(&f, nonce32);
    secp256k1_fe_cmov(&f, &secp256k1_fe_one, secp256k1_fe_normalizes_to_zero(&f));
    ctx->proj_blind = f;

    /* For a random blinding value b, set scalar_offset=diff-b, ge_offset=bG */
    secp256k1_rfc6979_hmac_sha256_generate(&rng, nonce32, 32);
    secp256k1_scalar_set_b32(&b, nonce32, NULL);
    /* The blinding value cannot be zero, as that would mean ge_offset = infinity,
     * which secp256k1_gej_add_ge cannot handle. */
    secp256k1_scalar_cmov(&b, &secp256k1_scalar_one, secp256k1_scalar_is_zero(&b));
    secp256k1_rfc6979_hmac_sha256_finalize(&rng);
    secp256k1_ecmult_gen(ctx, &gb, &b);
    secp256k1_scalar_negate(&b, &b);
    secp256k1_scalar_add(&ctx->scalar_offset, &b, &diff);
    secp256k1_ge_set_gej(&ctx->ge_offset, &gb);

    /* Clean up. */
    secp256k1_memclear(nonce32, sizeof(nonce32));
    secp256k1_scalar_clear(&b);
    secp256k1_gej_clear(&gb);
    secp256k1_fe_clear(&f);
    secp256k1_rfc6979_hmac_sha256_clear(&rng);
}